

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::Decode
          (GED_EnhancedFixedWingAircraft *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    GED_BasicFixedWingAircraft::Decode(&this->super_GED_BasicFixedWingAircraft,stream);
    KDataStream::Read(stream,&this->m_ui8SupFuelStatus);
    KDataStream::Read(stream,&this->m_ui8AirMaintStatus);
    KDataStream::Read(stream,&this->m_ui8PriAmmun);
    KDataStream::Read(stream,&this->m_ui8SecAmmun);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GED_EnhancedFixedWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_FIXED_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicFixedWingAircraft::Decode( stream );

    stream >> m_ui8SupFuelStatus
           >> m_ui8AirMaintStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}